

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  RTCRayQueryContext *pRVar8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  undefined4 uVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  long lVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong in_R9;
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  float *vertices;
  int *piVar55;
  ulong uVar56;
  ulong uVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar66 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  float fVar81;
  float fVar94;
  float fVar95;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar110 [16];
  float fVar109;
  undefined1 auVar111 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar120;
  undefined1 auVar119 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [64];
  float fVar129;
  uint uVar130;
  undefined1 auVar131 [16];
  float fVar133;
  uint uVar134;
  float fVar135;
  uint uVar136;
  float fVar137;
  uint uVar138;
  undefined1 auVar132 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  int local_26b4;
  undefined1 local_26b0 [8];
  float fStack_26a8;
  float fStack_26a4;
  undefined1 local_26a0 [8];
  float fStack_2698;
  float fStack_2694;
  undefined1 local_2690 [16];
  Scene *local_2678;
  RTCFilterFunctionNArguments local_2670;
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  ulong local_2628;
  ulong local_2620;
  ulong local_2618;
  ulong local_2610;
  undefined1 (*local_2608) [16];
  long local_2600;
  long local_25f8;
  float local_25f0;
  uint local_25ec;
  undefined4 local_25e8;
  float local_25e4;
  float local_25e0;
  undefined4 local_25dc;
  uint local_25d8;
  uint local_25d4;
  uint local_25d0;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  undefined1 local_25a0 [32];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2550 [16];
  float local_2540 [4];
  float local_2530 [4];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined1 local_24d0 [8];
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [8];
  float fStack_24b8;
  float fStack_24b4;
  undefined1 local_24b0 [8];
  float fStack_24a8;
  float fStack_24a4;
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar39;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_2608 = (undefined1 (*) [16])local_2390;
      auVar84 = ZEXT816(0) << 0x40;
      auVar112 = ZEXT1664(auVar84);
      auVar70 = vmaxss_avx(auVar84,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar85 = vmaxss_avx(auVar84,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar4 = (ray->super_RayK<1>).dir.field_0;
      auVar84._8_4_ = 0x7fffffff;
      auVar84._0_8_ = 0x7fffffff7fffffff;
      auVar84._12_4_ = 0x7fffffff;
      auVar84 = vandps_avx((undefined1  [16])aVar4,auVar84);
      auVar102._8_4_ = 0x219392ef;
      auVar102._0_8_ = 0x219392ef219392ef;
      auVar102._12_4_ = 0x219392ef;
      auVar84 = vcmpps_avx(auVar84,auVar102,1);
      auVar84 = vblendvps_avx((undefined1  [16])aVar4,auVar102,auVar84);
      auVar102 = vrcpps_avx(auVar84);
      fVar58 = auVar102._0_4_;
      auVar82._0_4_ = auVar84._0_4_ * fVar58;
      fVar67 = auVar102._4_4_;
      auVar82._4_4_ = auVar84._4_4_ * fVar67;
      fVar68 = auVar102._8_4_;
      auVar82._8_4_ = auVar84._8_4_ * fVar68;
      fVar69 = auVar102._12_4_;
      auVar82._12_4_ = auVar84._12_4_ * fVar69;
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = &DAT_3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar84 = vsubps_avx(auVar103,auVar82);
      uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar35;
      local_23c0._0_4_ = uVar35;
      local_23c0._8_4_ = uVar35;
      local_23c0._12_4_ = uVar35;
      local_23c0._16_4_ = uVar35;
      local_23c0._20_4_ = uVar35;
      local_23c0._24_4_ = uVar35;
      local_23c0._28_4_ = uVar35;
      auVar119 = ZEXT3264(local_23c0);
      uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar35;
      local_23e0._0_4_ = uVar35;
      local_23e0._8_4_ = uVar35;
      local_23e0._12_4_ = uVar35;
      local_23e0._16_4_ = uVar35;
      local_23e0._20_4_ = uVar35;
      local_23e0._24_4_ = uVar35;
      local_23e0._28_4_ = uVar35;
      auVar122 = ZEXT3264(local_23e0);
      auVar83._0_4_ = fVar58 + fVar58 * auVar84._0_4_;
      auVar83._4_4_ = fVar67 + fVar67 * auVar84._4_4_;
      auVar83._8_4_ = fVar68 + fVar68 * auVar84._8_4_;
      auVar83._12_4_ = fVar69 + fVar69 * auVar84._12_4_;
      uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar35;
      local_2400._0_4_ = uVar35;
      local_2400._8_4_ = uVar35;
      local_2400._12_4_ = uVar35;
      local_2400._16_4_ = uVar35;
      local_2400._20_4_ = uVar35;
      local_2400._24_4_ = uVar35;
      local_2400._28_4_ = uVar35;
      auVar125 = ZEXT3264(local_2400);
      auVar84 = vshufps_avx(auVar83,auVar83,0);
      local_2420._16_16_ = auVar84;
      local_2420._0_16_ = auVar84;
      auVar132 = ZEXT3264(local_2420);
      auVar84 = vmovshdup_avx(auVar83);
      auVar101 = ZEXT1664(auVar84);
      auVar102 = vshufps_avx(auVar83,auVar83,0x55);
      local_2440._16_16_ = auVar102;
      local_2440._0_16_ = auVar102;
      auVar140 = ZEXT3264(local_2440);
      auVar102 = vshufpd_avx(auVar83,auVar83,1);
      auVar108 = ZEXT1664(auVar102);
      auVar82 = vshufps_avx(auVar83,auVar83,0xaa);
      local_2610 = (ulong)(auVar83._0_4_ < 0.0) << 5;
      uVar56 = (ulong)(auVar84._0_4_ < 0.0) << 5 | 0x40;
      local_2460._16_16_ = auVar82;
      local_2460._0_16_ = auVar82;
      auVar142 = ZEXT3264(local_2460);
      uVar53 = (ulong)(auVar102._0_4_ < 0.0) << 5 | 0x80;
      auVar84 = vshufps_avx(auVar70,auVar70,0);
      local_2480._16_16_ = auVar84;
      local_2480._0_16_ = auVar84;
      auVar144 = ZEXT3264(local_2480);
      auVar84 = vshufps_avx(auVar85,auVar85,0);
      auVar66 = ZEXT3264(CONCAT1616(auVar84,auVar84));
      local_25c0 = mm_lookupmask_ps._240_8_;
      uStack_25b8 = mm_lookupmask_ps._248_8_;
      local_2618 = uVar56;
      local_2620 = uVar53;
      local_2628 = local_2610 ^ 0x20;
      uVar39 = local_2610;
      uVar43 = uVar53;
      uVar46 = local_2610 ^ 0x20;
      uVar47 = uVar56;
      do {
        do {
          fVar58 = (ray->super_RayK<1>).tfar;
          auVar80 = ZEXT464((uint)fVar58);
          do {
            if (local_2608 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar50 = local_2608 + -1;
            local_2608 = local_2608 + -1;
          } while (fVar58 < *(float *)(*pauVar50 + 8));
          uVar41 = *(ulong *)*local_2608;
          do {
            auVar124 = auVar125._0_32_;
            auVar121 = auVar122._0_32_;
            auVar118 = auVar119._0_32_;
            if ((uVar41 & 8) == 0) {
              uVar36 = uVar41 & 0xfffffffffffffff0;
              fVar58 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar93._4_4_ = fVar58;
              auVar93._0_4_ = fVar58;
              auVar93._8_4_ = fVar58;
              auVar93._12_4_ = fVar58;
              auVar93._16_4_ = fVar58;
              auVar93._20_4_ = fVar58;
              auVar93._24_4_ = fVar58;
              auVar93._28_4_ = fVar58;
              pfVar3 = (float *)(uVar36 + 0x100 + uVar39);
              pfVar1 = (float *)(uVar36 + 0x40 + uVar39);
              auVar79._0_4_ = fVar58 * *pfVar3 + *pfVar1;
              auVar79._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
              auVar79._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
              auVar79._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
              auVar79._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
              auVar79._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
              auVar79._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
              auVar79._28_4_ = auVar80._28_4_ + pfVar1[7];
              auVar79 = vsubps_avx(auVar79,auVar118);
              auVar25._4_4_ = auVar132._4_4_ * auVar79._4_4_;
              auVar25._0_4_ = auVar132._0_4_ * auVar79._0_4_;
              auVar25._8_4_ = auVar132._8_4_ * auVar79._8_4_;
              auVar25._12_4_ = auVar132._12_4_ * auVar79._12_4_;
              auVar25._16_4_ = auVar132._16_4_ * auVar79._16_4_;
              auVar25._20_4_ = auVar132._20_4_ * auVar79._20_4_;
              auVar25._24_4_ = auVar132._24_4_ * auVar79._24_4_;
              auVar25._28_4_ = auVar79._28_4_;
              pfVar3 = (float *)(uVar36 + 0x100 + uVar47);
              pfVar1 = (float *)(uVar36 + 0x40 + uVar47);
              auVar99._0_4_ = fVar58 * *pfVar3 + *pfVar1;
              auVar99._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
              auVar99._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
              auVar99._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
              auVar99._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
              auVar99._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
              auVar99._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
              auVar99._28_4_ = auVar101._28_4_ + pfVar1[7];
              auVar79 = vmaxps_avx(auVar144._0_32_,auVar25);
              auVar25 = vsubps_avx(auVar99,auVar121);
              pfVar3 = (float *)(uVar36 + 0x100 + uVar43);
              auVar9._4_4_ = auVar140._4_4_ * auVar25._4_4_;
              auVar9._0_4_ = auVar140._0_4_ * auVar25._0_4_;
              auVar9._8_4_ = auVar140._8_4_ * auVar25._8_4_;
              auVar9._12_4_ = auVar140._12_4_ * auVar25._12_4_;
              auVar9._16_4_ = auVar140._16_4_ * auVar25._16_4_;
              auVar9._20_4_ = auVar140._20_4_ * auVar25._20_4_;
              auVar9._24_4_ = auVar140._24_4_ * auVar25._24_4_;
              auVar9._28_4_ = auVar25._28_4_;
              pfVar1 = (float *)(uVar36 + 0x40 + uVar43);
              auVar106._0_4_ = fVar58 * *pfVar3 + *pfVar1;
              auVar106._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
              auVar106._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
              auVar106._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
              auVar106._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
              auVar106._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
              auVar106._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
              auVar106._28_4_ = auVar108._28_4_ + pfVar1[7];
              auVar25 = vsubps_avx(auVar106,auVar124);
              auVar26._4_4_ = auVar142._4_4_ * auVar25._4_4_;
              auVar26._0_4_ = auVar142._0_4_ * auVar25._0_4_;
              auVar26._8_4_ = auVar142._8_4_ * auVar25._8_4_;
              auVar26._12_4_ = auVar142._12_4_ * auVar25._12_4_;
              auVar26._16_4_ = auVar142._16_4_ * auVar25._16_4_;
              auVar26._20_4_ = auVar142._20_4_ * auVar25._20_4_;
              fVar67 = auVar25._28_4_;
              auVar26._24_4_ = auVar142._24_4_ * auVar25._24_4_;
              auVar26._28_4_ = fVar67;
              auVar25 = vmaxps_avx(auVar9,auVar26);
              pfVar3 = (float *)(uVar36 + 0x100 + uVar46);
              local_25a0 = vmaxps_avx(auVar79,auVar25);
              auVar80 = ZEXT3264(local_25a0);
              pfVar1 = (float *)(uVar36 + 0x40 + uVar46);
              auVar100._0_4_ = fVar58 * *pfVar3 + *pfVar1;
              auVar100._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
              auVar100._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
              auVar100._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
              auVar100._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
              auVar100._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
              auVar100._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
              auVar100._28_4_ = fVar67 + pfVar1[7];
              auVar79 = vsubps_avx(auVar100,auVar118);
              pfVar3 = (float *)(uVar36 + 0x100 + (uVar56 ^ 0x20));
              pfVar1 = (float *)(uVar36 + 0x40 + (uVar56 ^ 0x20));
              auVar107._0_4_ = fVar58 * *pfVar3 + *pfVar1;
              auVar107._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
              auVar107._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
              auVar107._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
              auVar107._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
              auVar107._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
              auVar107._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
              auVar107._28_4_ = fVar67 + pfVar1[7];
              auVar27._4_4_ = auVar132._4_4_ * auVar79._4_4_;
              auVar27._0_4_ = auVar132._0_4_ * auVar79._0_4_;
              auVar27._8_4_ = auVar132._8_4_ * auVar79._8_4_;
              auVar27._12_4_ = auVar132._12_4_ * auVar79._12_4_;
              auVar27._16_4_ = auVar132._16_4_ * auVar79._16_4_;
              auVar27._20_4_ = auVar132._20_4_ * auVar79._20_4_;
              auVar27._24_4_ = auVar132._24_4_ * auVar79._24_4_;
              auVar27._28_4_ = auVar79._28_4_;
              auVar79 = vsubps_avx(auVar107,auVar121);
              pfVar3 = (float *)(uVar36 + 0x100 + (uVar53 ^ 0x20));
              auVar28._4_4_ = auVar140._4_4_ * auVar79._4_4_;
              auVar28._0_4_ = auVar140._0_4_ * auVar79._0_4_;
              auVar28._8_4_ = auVar140._8_4_ * auVar79._8_4_;
              auVar28._12_4_ = auVar140._12_4_ * auVar79._12_4_;
              auVar28._16_4_ = auVar140._16_4_ * auVar79._16_4_;
              auVar28._20_4_ = auVar140._20_4_ * auVar79._20_4_;
              auVar28._24_4_ = auVar140._24_4_ * auVar79._24_4_;
              auVar28._28_4_ = auVar79._28_4_;
              pfVar1 = (float *)(uVar36 + 0x40 + (uVar53 ^ 0x20));
              auVar111._0_4_ = fVar58 * *pfVar3 + *pfVar1;
              auVar111._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
              auVar111._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
              auVar111._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
              auVar111._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
              auVar111._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
              auVar111._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
              auVar111._28_4_ = auVar112._28_4_ + pfVar1[7];
              auVar79 = vsubps_avx(auVar111,auVar124);
              auVar29._4_4_ = auVar142._4_4_ * auVar79._4_4_;
              auVar29._0_4_ = auVar142._0_4_ * auVar79._0_4_;
              auVar29._8_4_ = auVar142._8_4_ * auVar79._8_4_;
              auVar29._12_4_ = auVar142._12_4_ * auVar79._12_4_;
              auVar29._16_4_ = auVar142._16_4_ * auVar79._16_4_;
              auVar29._20_4_ = auVar142._20_4_ * auVar79._20_4_;
              auVar29._24_4_ = auVar142._24_4_ * auVar79._24_4_;
              auVar29._28_4_ = auVar79._28_4_;
              auVar112 = ZEXT3264(auVar29);
              auVar25 = vminps_avx(auVar28,auVar29);
              auVar79 = vminps_avx(auVar66._0_32_,auVar27);
              auVar79 = vminps_avx(auVar79,auVar25);
              auVar79 = vcmpps_avx(local_25a0,auVar79,2);
              auVar101 = ZEXT3264(auVar79);
              if (((uint)uVar41 & 7) == 6) {
                auVar25 = vcmpps_avx(*(undefined1 (*) [32])(uVar36 + 0x1c0),auVar93,2);
                auVar9 = vcmpps_avx(auVar93,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
                auVar9 = vandps_avx(auVar25,auVar9);
                auVar79 = vandps_avx(auVar9,auVar79);
                auVar101 = ZEXT1664(auVar79._16_16_);
                auVar84 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
              }
              else {
                auVar84 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
              }
              auVar108 = ZEXT3264(auVar25);
              auVar84 = vpsllw_avx(auVar84,0xf);
              auVar84 = vpacksswb_avx(auVar84,auVar84);
              in_R9 = (ulong)(byte)(SUB161(auVar84 >> 7,0) & 1 | (SUB161(auVar84 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar84 >> 0x3f,0) << 7);
            }
            if ((uVar41 & 8) == 0) {
              if (in_R9 == 0) {
                iVar34 = 4;
              }
              else {
                uVar36 = uVar41 & 0xfffffffffffffff0;
                lVar38 = 0;
                if (in_R9 != 0) {
                  for (; (in_R9 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                iVar34 = 0;
                uVar41 = *(ulong *)(uVar36 + lVar38 * 8);
                uVar48 = in_R9 - 1 & in_R9;
                if (uVar48 != 0) {
                  uVar130 = *(uint *)(local_25a0 + lVar38 * 4);
                  lVar38 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                    }
                  }
                  uVar49 = *(ulong *)(uVar36 + lVar38 * 8);
                  uVar134 = *(uint *)(local_25a0 + lVar38 * 4);
                  uVar48 = uVar48 - 1 & uVar48;
                  if (uVar48 == 0) {
                    if (uVar130 < uVar134) {
                      *(ulong *)*local_2608 = uVar49;
                      *(uint *)(*local_2608 + 8) = uVar134;
                      local_2608 = local_2608 + 1;
                    }
                    else {
                      *(ulong *)*local_2608 = uVar41;
                      *(uint *)(*local_2608 + 8) = uVar130;
                      uVar41 = uVar49;
                      local_2608 = local_2608 + 1;
                    }
                  }
                  else {
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar41;
                    auVar84 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar130));
                    auVar85._8_8_ = 0;
                    auVar85._0_8_ = uVar49;
                    auVar70 = vpunpcklqdq_avx(auVar85,ZEXT416(uVar134));
                    lVar38 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
                    auVar85 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_25a0 + lVar38 * 4)));
                    uVar48 = uVar48 - 1 & uVar48;
                    if (uVar48 == 0) {
                      auVar102 = vpcmpgtd_avx(auVar70,auVar84);
                      auVar82 = vpshufd_avx(auVar102,0xaa);
                      auVar102 = vblendvps_avx(auVar70,auVar84,auVar82);
                      auVar84 = vblendvps_avx(auVar84,auVar70,auVar82);
                      auVar70 = vpcmpgtd_avx(auVar85,auVar102);
                      auVar82 = vpshufd_avx(auVar70,0xaa);
                      auVar70 = vblendvps_avx(auVar85,auVar102,auVar82);
                      auVar108 = ZEXT1664(auVar70);
                      auVar85 = vblendvps_avx(auVar102,auVar85,auVar82);
                      auVar102 = vpcmpgtd_avx(auVar85,auVar84);
                      auVar82 = vpshufd_avx(auVar102,0xaa);
                      auVar101 = ZEXT1664(auVar82);
                      auVar102 = vblendvps_avx(auVar85,auVar84,auVar82);
                      auVar112 = ZEXT1664(auVar102);
                      auVar84 = vblendvps_avx(auVar84,auVar85,auVar82);
                      auVar80 = ZEXT1664(auVar84);
                      *local_2608 = auVar84;
                      local_2608[1] = auVar102;
                      uVar41 = auVar70._0_8_;
                      local_2608 = local_2608 + 2;
                    }
                    else {
                      lVar38 = 0;
                      if (uVar48 != 0) {
                        for (; (uVar48 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                        }
                      }
                      auVar112 = ZEXT464(*(uint *)(local_25a0 + lVar38 * 4));
                      auVar104._8_8_ = 0;
                      auVar104._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
                      auVar102 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_25a0 + lVar38 * 4)
                                                                 ));
                      uVar48 = uVar48 - 1 & uVar48;
                      if (uVar48 == 0) {
                        auVar82 = vpcmpgtd_avx(auVar70,auVar84);
                        auVar83 = vpshufd_avx(auVar82,0xaa);
                        auVar82 = vblendvps_avx(auVar70,auVar84,auVar83);
                        auVar84 = vblendvps_avx(auVar84,auVar70,auVar83);
                        auVar70 = vpcmpgtd_avx(auVar102,auVar85);
                        auVar83 = vpshufd_avx(auVar70,0xaa);
                        auVar70 = vblendvps_avx(auVar102,auVar85,auVar83);
                        auVar85 = vblendvps_avx(auVar85,auVar102,auVar83);
                        auVar102 = vpcmpgtd_avx(auVar85,auVar84);
                        auVar83 = vpshufd_avx(auVar102,0xaa);
                        auVar102 = vblendvps_avx(auVar85,auVar84,auVar83);
                        auVar84 = vblendvps_avx(auVar84,auVar85,auVar83);
                        auVar85 = vpcmpgtd_avx(auVar70,auVar82);
                        auVar83 = vpshufd_avx(auVar85,0xaa);
                        auVar85 = vblendvps_avx(auVar70,auVar82,auVar83);
                        auVar70 = vblendvps_avx(auVar82,auVar70,auVar83);
                        auVar82 = vpcmpgtd_avx(auVar102,auVar70);
                        auVar83 = vpshufd_avx(auVar82,0xaa);
                        auVar112 = ZEXT1664(auVar83);
                        auVar82 = vblendvps_avx(auVar102,auVar70,auVar83);
                        auVar70 = vblendvps_avx(auVar70,auVar102,auVar83);
                        *local_2608 = auVar84;
                        local_2608[1] = auVar70;
                        local_2608[2] = auVar82;
                        uVar41 = auVar85._0_8_;
                        pauVar50 = local_2608 + 3;
                      }
                      else {
                        *local_2608 = auVar84;
                        local_2608[1] = auVar70;
                        local_2608[2] = auVar85;
                        local_2608[3] = auVar102;
                        lVar38 = 0x30;
                        do {
                          lVar44 = lVar38;
                          lVar38 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                            }
                          }
                          auVar71._8_8_ = 0;
                          auVar71._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
                          auVar84 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_25a0 +
                                                                             lVar38 * 4)));
                          *(undefined1 (*) [16])(local_2608[1] + lVar44) = auVar84;
                          uVar48 = uVar48 & uVar48 - 1;
                          lVar38 = lVar44 + 0x10;
                        } while (uVar48 != 0);
                        pauVar50 = (undefined1 (*) [16])(local_2608[1] + lVar44);
                        if (lVar44 + 0x10 != 0) {
                          lVar38 = 0x10;
                          pauVar42 = local_2608;
                          do {
                            auVar84 = pauVar42[1];
                            uVar130 = *(uint *)(pauVar42[1] + 8);
                            pauVar42 = pauVar42 + 1;
                            lVar44 = lVar38;
                            do {
                              if (uVar130 <= *(uint *)(local_2608[-1] + lVar44 + 8)) {
                                pauVar45 = (undefined1 (*) [16])(*local_2608 + lVar44);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2608 + lVar44) =
                                   *(undefined1 (*) [16])(local_2608[-1] + lVar44);
                              lVar44 = lVar44 + -0x10;
                              pauVar45 = local_2608;
                            } while (lVar44 != 0);
                            *pauVar45 = auVar84;
                            lVar38 = lVar38 + 0x10;
                          } while (pauVar50 != pauVar42);
                        }
                        uVar41 = *(ulong *)*pauVar50;
                      }
                      auVar80 = ZEXT1664(auVar84);
                      auVar108 = ZEXT1664(auVar102);
                      auVar101 = ZEXT1664(auVar85);
                      auVar119 = ZEXT3264(auVar118);
                      auVar122 = ZEXT3264(auVar121);
                      auVar125 = ZEXT3264(auVar124);
                      auVar132 = ZEXT3264(auVar132._0_32_);
                      auVar140 = ZEXT3264(auVar140._0_32_);
                      auVar142 = ZEXT3264(auVar142._0_32_);
                      auVar144 = ZEXT3264(auVar144._0_32_);
                      local_2608 = pauVar50;
                    }
                  }
                }
              }
            }
            else {
              iVar34 = 6;
            }
          } while (iVar34 == 0);
        } while (iVar34 != 6);
        local_2600 = (ulong)((uint)uVar41 & 0xf) - 8;
        if (local_2600 != 0) {
          uVar41 = uVar41 & 0xfffffffffffffff0;
          local_2678 = context->scene;
          lVar38 = 0;
          do {
            local_25f8 = lVar38;
            lVar37 = lVar38 * 0x50;
            pGVar6 = (local_2678->geometries).items[*(uint *)(uVar41 + 0x30 + lVar37)].ptr;
            fVar58 = (pGVar6->time_range).lower;
            fVar58 = pGVar6->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar58) /
                     ((pGVar6->time_range).upper - fVar58));
            auVar84 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
            auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar60 = vmaxss_avx(ZEXT816(0),auVar84);
            lVar40 = (long)(int)auVar60._0_4_ * 0x38;
            uVar43 = (ulong)*(uint *)(uVar41 + 4 + lVar37);
            lVar44 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar40);
            lVar40 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar40);
            auVar84 = *(undefined1 (*) [16])(lVar44 + (ulong)*(uint *)(uVar41 + lVar37) * 4);
            uVar39 = (ulong)*(uint *)(uVar41 + 0x10 + lVar37);
            auVar70 = *(undefined1 (*) [16])(lVar44 + uVar39 * 4);
            uVar46 = (ulong)*(uint *)(uVar41 + 0x20 + lVar37);
            auVar62 = *(undefined1 (*) [16])(lVar44 + uVar46 * 4);
            auVar85 = *(undefined1 (*) [16])(lVar44 + uVar43 * 4);
            uVar47 = (ulong)*(uint *)(uVar41 + 0x14 + lVar37);
            auVar102 = *(undefined1 (*) [16])(lVar44 + uVar47 * 4);
            uVar36 = (ulong)*(uint *)(uVar41 + 0x24 + lVar37);
            auVar72 = *(undefined1 (*) [16])(lVar44 + uVar36 * 4);
            uVar57 = (ulong)*(uint *)(uVar41 + 8 + lVar37);
            auVar82 = *(undefined1 (*) [16])(lVar44 + uVar57 * 4);
            uVar51 = (ulong)*(uint *)(uVar41 + 0x18 + lVar37);
            auVar83 = *(undefined1 (*) [16])(lVar44 + uVar51 * 4);
            uVar48 = (ulong)*(uint *)(uVar41 + 0x28 + lVar37);
            auVar103 = *(undefined1 (*) [16])(lVar44 + uVar48 * 4);
            uVar54 = (ulong)*(uint *)(uVar41 + 0xc + lVar37);
            auVar97 = *(undefined1 (*) [16])(lVar44 + uVar54 * 4);
            uVar52 = (ulong)*(uint *)(uVar41 + 0x1c + lVar37);
            auVar104 = *(undefined1 (*) [16])(lVar44 + uVar52 * 4);
            uVar49 = (ulong)*(uint *)(uVar41 + 0x2c + lVar37);
            auVar71 = *(undefined1 (*) [16])(lVar44 + uVar49 * 4);
            auVar5 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar41 + lVar37) * 4);
            auVar59 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
            fVar58 = fVar58 - auVar60._0_4_;
            auVar60 = vunpcklps_avx(auVar84,auVar82);
            auVar82 = vunpckhps_avx(auVar84,auVar82);
            auVar61 = vunpcklps_avx(auVar85,auVar97);
            auVar85 = vunpckhps_avx(auVar85,auVar97);
            auVar84 = *(undefined1 (*) [16])(lVar40 + uVar43 * 4);
            _local_24b0 = vunpcklps_avx(auVar82,auVar85);
            auVar32 = _local_24b0;
            auVar97 = vunpcklps_avx(auVar60,auVar61);
            _local_24d0 = vunpckhps_avx(auVar60,auVar61);
            auVar65 = _local_24d0;
            auVar82 = vunpcklps_avx(auVar70,auVar83);
            auVar85 = vunpckhps_avx(auVar70,auVar83);
            auVar83 = vunpcklps_avx(auVar102,auVar104);
            auVar102 = vunpckhps_avx(auVar102,auVar104);
            auVar70 = *(undefined1 (*) [16])(lVar40 + uVar57 * 4);
            auVar104 = vunpcklps_avx(auVar85,auVar102);
            auVar60 = vunpcklps_avx(auVar82,auVar83);
            _local_24c0 = vunpckhps_avx(auVar82,auVar83);
            auVar31 = _local_24c0;
            auVar83 = vunpcklps_avx(auVar62,auVar103);
            auVar102 = vunpckhps_avx(auVar62,auVar103);
            auVar103 = vunpcklps_avx(auVar72,auVar71);
            auVar82 = vunpckhps_avx(auVar72,auVar71);
            auVar85 = *(undefined1 (*) [16])(lVar40 + uVar54 * 4);
            auVar71 = vunpcklps_avx(auVar102,auVar82);
            _local_24a0 = vunpcklps_avx(auVar83,auVar103);
            auVar33 = _local_24a0;
            auVar102 = vunpckhps_avx(auVar83,auVar103);
            auVar82 = vunpcklps_avx(auVar5,auVar70);
            auVar70 = vunpckhps_avx(auVar5,auVar70);
            auVar83 = vunpcklps_avx(auVar84,auVar85);
            auVar85 = vunpckhps_avx(auVar84,auVar85);
            auVar84 = *(undefined1 (*) [16])(lVar40 + uVar51 * 4);
            auVar103 = vunpcklps_avx(auVar70,auVar85);
            auVar5 = vunpcklps_avx(auVar82,auVar83);
            auVar85 = vunpckhps_avx(auVar82,auVar83);
            auVar83 = vunpcklps_avx(auVar59,auVar84);
            auVar82 = vunpckhps_avx(auVar59,auVar84);
            auVar84 = *(undefined1 (*) [16])(lVar40 + uVar47 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar40 + uVar52 * 4);
            auVar59 = vunpcklps_avx(auVar84,auVar70);
            auVar84 = vunpckhps_avx(auVar84,auVar70);
            auVar61 = vunpcklps_avx(auVar82,auVar84);
            auVar62 = vunpcklps_avx(auVar83,auVar59);
            auVar82 = vunpckhps_avx(auVar83,auVar59);
            auVar84 = *(undefined1 (*) [16])(lVar40 + uVar46 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar40 + uVar48 * 4);
            auVar59 = vunpcklps_avx(auVar84,auVar70);
            auVar83 = vunpckhps_avx(auVar84,auVar70);
            auVar84 = *(undefined1 (*) [16])(lVar40 + uVar36 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar40 + uVar49 * 4);
            auVar72 = vunpcklps_avx(auVar84,auVar70);
            auVar84 = vunpckhps_avx(auVar84,auVar70);
            auVar73 = vunpcklps_avx(auVar83,auVar84);
            auVar74 = vunpcklps_avx(auVar59,auVar72);
            auVar83 = vunpckhps_avx(auVar59,auVar72);
            auVar84 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
            auVar70 = vshufps_avx(ZEXT416((uint)(1.0 - fVar58)),ZEXT416((uint)(1.0 - fVar58)),0);
            fVar58 = auVar84._0_4_;
            fVar67 = auVar84._4_4_;
            fVar68 = auVar84._8_4_;
            fVar69 = auVar84._12_4_;
            fVar120 = auVar70._0_4_;
            fVar147 = auVar70._4_4_;
            fVar148 = auVar70._8_4_;
            fVar149 = auVar70._12_4_;
            auVar143._0_4_ = fVar120 * auVar97._0_4_ + fVar58 * auVar5._0_4_;
            auVar143._4_4_ = fVar147 * auVar97._4_4_ + fVar67 * auVar5._4_4_;
            auVar143._8_4_ = fVar148 * auVar97._8_4_ + fVar68 * auVar5._8_4_;
            auVar143._12_4_ = fVar149 * auVar97._12_4_ + fVar69 * auVar5._12_4_;
            auVar110._0_4_ = fVar120 * (float)local_24d0._0_4_ + fVar58 * auVar85._0_4_;
            auVar110._4_4_ = fVar147 * (float)local_24d0._4_4_ + fVar67 * auVar85._4_4_;
            auVar110._8_4_ = fVar148 * fStack_24c8 + fVar68 * auVar85._8_4_;
            auVar110._12_4_ = fVar149 * fStack_24c4 + fVar69 * auVar85._12_4_;
            auVar116._0_4_ = fVar120 * (float)local_24b0._0_4_ + fVar58 * auVar103._0_4_;
            auVar116._4_4_ = fVar147 * (float)local_24b0._4_4_ + fVar67 * auVar103._4_4_;
            auVar116._8_4_ = fVar148 * fStack_24a8 + fVar68 * auVar103._8_4_;
            auVar116._12_4_ = fVar149 * fStack_24a4 + fVar69 * auVar103._12_4_;
            auVar72._0_4_ = fVar120 * auVar60._0_4_ + fVar58 * auVar62._0_4_;
            auVar72._4_4_ = fVar147 * auVar60._4_4_ + fVar67 * auVar62._4_4_;
            auVar72._8_4_ = fVar148 * auVar60._8_4_ + fVar68 * auVar62._8_4_;
            auVar72._12_4_ = fVar149 * auVar60._12_4_ + fVar69 * auVar62._12_4_;
            auVar86._0_4_ = fVar120 * (float)local_24c0._0_4_ + fVar58 * auVar82._0_4_;
            auVar86._4_4_ = fVar147 * (float)local_24c0._4_4_ + fVar67 * auVar82._4_4_;
            auVar86._8_4_ = fVar148 * fStack_24b8 + fVar68 * auVar82._8_4_;
            auVar86._12_4_ = fVar149 * fStack_24b4 + fVar69 * auVar82._12_4_;
            puVar2 = (undefined8 *)(uVar41 + 0x30 + lVar37);
            local_2490 = *puVar2;
            uStack_2488 = puVar2[1];
            puVar2 = (undefined8 *)(uVar41 + 0x40 + lVar37);
            local_2640._0_4_ = auVar104._0_4_;
            local_2640._4_4_ = auVar104._4_4_;
            fStack_2638 = auVar104._8_4_;
            fStack_2634 = auVar104._12_4_;
            auVar131._0_4_ = fVar120 * (float)local_2640._0_4_ + auVar61._0_4_ * fVar58;
            auVar131._4_4_ = fVar147 * (float)local_2640._4_4_ + auVar61._4_4_ * fVar67;
            auVar131._8_4_ = fVar148 * fStack_2638 + auVar61._8_4_ * fVar68;
            auVar131._12_4_ = fVar149 * fStack_2634 + auVar61._12_4_ * fVar69;
            auVar139._0_4_ = fVar120 * (float)local_24a0._0_4_ + auVar74._0_4_ * fVar58;
            auVar139._4_4_ = fVar147 * (float)local_24a0._4_4_ + auVar74._4_4_ * fVar67;
            auVar139._8_4_ = fVar148 * fStack_2498 + auVar74._8_4_ * fVar68;
            auVar139._12_4_ = fVar149 * fStack_2494 + auVar74._12_4_ * fVar69;
            local_26b0._0_4_ = auVar102._0_4_;
            local_26b0._4_4_ = auVar102._4_4_;
            fStack_26a8 = auVar102._8_4_;
            fStack_26a4 = auVar102._12_4_;
            auVar141._0_4_ = auVar83._0_4_ * fVar58 + fVar120 * (float)local_26b0._0_4_;
            auVar141._4_4_ = auVar83._4_4_ * fVar67 + fVar147 * (float)local_26b0._4_4_;
            auVar141._8_4_ = auVar83._8_4_ * fVar68 + fVar148 * fStack_26a8;
            auVar141._12_4_ = auVar83._12_4_ * fVar69 + fVar149 * fStack_26a4;
            local_26a0._0_4_ = auVar71._0_4_;
            local_26a0._4_4_ = auVar71._4_4_;
            fStack_2698 = auVar71._8_4_;
            fStack_2694 = auVar71._12_4_;
            auVar59._0_4_ = fVar120 * (float)local_26a0._0_4_ + auVar73._0_4_ * fVar58;
            auVar59._4_4_ = fVar147 * (float)local_26a0._4_4_ + auVar73._4_4_ * fVar67;
            auVar59._8_4_ = fVar148 * fStack_2698 + auVar73._8_4_ * fVar68;
            auVar59._12_4_ = fVar149 * fStack_2694 + auVar73._12_4_ * fVar69;
            local_25b0 = *puVar2;
            uStack_25a8 = puVar2[1];
            auVar84 = vsubps_avx(auVar143,auVar72);
            auVar70 = vsubps_avx(auVar110,auVar86);
            auVar85 = vsubps_avx(auVar116,auVar131);
            auVar102 = vsubps_avx(auVar139,auVar143);
            auVar82 = vsubps_avx(auVar141,auVar110);
            auVar83 = vsubps_avx(auVar59,auVar116);
            fVar69 = auVar83._0_4_;
            fVar123 = auVar70._0_4_;
            auVar60._0_4_ = fVar123 * fVar69;
            fVar10 = auVar83._4_4_;
            fVar126 = auVar70._4_4_;
            auVar60._4_4_ = fVar126 * fVar10;
            fVar15 = auVar83._8_4_;
            fVar127 = auVar70._8_4_;
            auVar60._8_4_ = fVar127 * fVar15;
            fVar20 = auVar83._12_4_;
            fVar128 = auVar70._12_4_;
            auVar60._12_4_ = fVar128 * fVar20;
            fVar120 = auVar82._0_4_;
            fVar129 = auVar85._0_4_;
            auVar73._0_4_ = fVar129 * fVar120;
            fVar11 = auVar82._4_4_;
            fVar133 = auVar85._4_4_;
            auVar73._4_4_ = fVar133 * fVar11;
            fVar16 = auVar82._8_4_;
            fVar135 = auVar85._8_4_;
            auVar73._8_4_ = fVar135 * fVar16;
            fVar21 = auVar82._12_4_;
            fVar137 = auVar85._12_4_;
            auVar73._12_4_ = fVar137 * fVar21;
            local_2510 = vsubps_avx(auVar73,auVar60);
            fVar147 = auVar102._0_4_;
            auVar74._0_4_ = fVar129 * fVar147;
            fVar12 = auVar102._4_4_;
            auVar74._4_4_ = fVar133 * fVar12;
            fVar17 = auVar102._8_4_;
            auVar74._8_4_ = fVar135 * fVar17;
            fVar22 = auVar102._12_4_;
            auVar74._12_4_ = fVar137 * fVar22;
            fVar148 = auVar84._0_4_;
            auVar87._0_4_ = fVar69 * fVar148;
            fVar13 = auVar84._4_4_;
            auVar87._4_4_ = fVar10 * fVar13;
            fVar18 = auVar84._8_4_;
            auVar87._8_4_ = fVar15 * fVar18;
            fVar23 = auVar84._12_4_;
            auVar87._12_4_ = fVar20 * fVar23;
            local_2500 = vsubps_avx(auVar87,auVar74);
            auVar108 = ZEXT1664(local_2500);
            auVar88._0_4_ = fVar120 * fVar148;
            auVar88._4_4_ = fVar11 * fVar13;
            auVar88._8_4_ = fVar16 * fVar18;
            auVar88._12_4_ = fVar21 * fVar23;
            auVar98._0_4_ = fVar123 * fVar147;
            auVar98._4_4_ = fVar126 * fVar12;
            auVar98._8_4_ = fVar127 * fVar17;
            auVar98._12_4_ = fVar128 * fVar22;
            auVar85 = vsubps_avx(auVar98,auVar88);
            auVar101 = ZEXT1664(auVar85);
            uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar61._4_4_ = uVar35;
            auVar61._0_4_ = uVar35;
            auVar61._8_4_ = uVar35;
            auVar61._12_4_ = uVar35;
            uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar145._4_4_ = uVar35;
            auVar145._0_4_ = uVar35;
            auVar145._8_4_ = uVar35;
            auVar145._12_4_ = uVar35;
            uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar150._4_4_ = uVar35;
            auVar150._0_4_ = uVar35;
            auVar150._8_4_ = uVar35;
            auVar150._12_4_ = uVar35;
            fVar58 = (ray->super_RayK<1>).dir.field_0.m128[1];
            _local_2640 = vsubps_avx(auVar143,auVar61);
            fVar67 = (ray->super_RayK<1>).dir.field_0.m128[2];
            _local_26a0 = vsubps_avx(auVar110,auVar145);
            auVar112 = ZEXT1664(_local_26a0);
            _local_26b0 = vsubps_avx(auVar116,auVar150);
            fVar149 = local_26b0._0_4_;
            auVar117._0_4_ = fVar58 * fVar149;
            fVar14 = local_26b0._4_4_;
            auVar117._4_4_ = fVar58 * fVar14;
            fVar19 = local_26b0._8_4_;
            auVar117._8_4_ = fVar58 * fVar19;
            fVar24 = local_26b0._12_4_;
            auVar117._12_4_ = fVar58 * fVar24;
            fVar109 = local_26a0._0_4_;
            auVar146._0_4_ = fVar109 * fVar67;
            fVar113 = local_26a0._4_4_;
            auVar146._4_4_ = fVar113 * fVar67;
            fVar114 = local_26a0._8_4_;
            auVar146._8_4_ = fVar114 * fVar67;
            fVar115 = local_26a0._12_4_;
            auVar146._12_4_ = fVar115 * fVar67;
            auVar70 = vsubps_avx(auVar146,auVar117);
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar81 = local_2640._0_4_;
            auVar151._0_4_ = fVar81 * fVar67;
            fVar94 = local_2640._4_4_;
            auVar151._4_4_ = fVar94 * fVar67;
            fVar95 = local_2640._8_4_;
            auVar151._8_4_ = fVar95 * fVar67;
            fVar96 = local_2640._12_4_;
            auVar151._12_4_ = fVar96 * fVar67;
            auVar75._0_4_ = fVar68 * fVar149;
            auVar75._4_4_ = fVar68 * fVar14;
            auVar75._8_4_ = fVar68 * fVar19;
            auVar75._12_4_ = fVar68 * fVar24;
            auVar102 = vsubps_avx(auVar75,auVar151);
            auVar152._0_4_ = fVar68 * fVar109;
            auVar152._4_4_ = fVar68 * fVar113;
            auVar152._8_4_ = fVar68 * fVar114;
            auVar152._12_4_ = fVar68 * fVar115;
            auVar89._0_4_ = fVar58 * fVar81;
            auVar89._4_4_ = fVar58 * fVar94;
            auVar89._8_4_ = fVar58 * fVar95;
            auVar89._12_4_ = fVar58 * fVar96;
            auVar82 = vsubps_avx(auVar89,auVar152);
            auVar62._0_4_ =
                 local_2510._0_4_ * fVar68 + fVar58 * local_2500._0_4_ + auVar85._0_4_ * fVar67;
            auVar62._4_4_ =
                 local_2510._4_4_ * fVar68 + fVar58 * local_2500._4_4_ + auVar85._4_4_ * fVar67;
            auVar62._8_4_ =
                 local_2510._8_4_ * fVar68 + fVar58 * local_2500._8_4_ + auVar85._8_4_ * fVar67;
            auVar62._12_4_ =
                 local_2510._12_4_ * fVar68 + fVar58 * local_2500._12_4_ + auVar85._12_4_ * fVar67;
            auVar90._8_8_ = 0x8000000080000000;
            auVar90._0_8_ = 0x8000000080000000;
            auVar84 = vandps_avx(auVar62,auVar90);
            uVar130 = auVar84._0_4_;
            local_25a0._0_4_ =
                 (float)(uVar130 ^
                        (uint)(fVar147 * auVar70._0_4_ +
                              fVar120 * auVar102._0_4_ + fVar69 * auVar82._0_4_));
            uVar134 = auVar84._4_4_;
            local_25a0._4_4_ =
                 (float)(uVar134 ^
                        (uint)(fVar12 * auVar70._4_4_ +
                              fVar11 * auVar102._4_4_ + fVar10 * auVar82._4_4_));
            uVar136 = auVar84._8_4_;
            local_25a0._8_4_ =
                 (float)(uVar136 ^
                        (uint)(fVar17 * auVar70._8_4_ +
                              fVar16 * auVar102._8_4_ + fVar15 * auVar82._8_4_));
            uVar138 = auVar84._12_4_;
            local_25a0._12_4_ =
                 (float)(uVar138 ^
                        (uint)(fVar22 * auVar70._12_4_ +
                              fVar21 * auVar102._12_4_ + fVar20 * auVar82._12_4_));
            local_25a0._16_4_ =
                 (float)(uVar130 ^
                        (uint)(fVar148 * auVar70._0_4_ +
                              fVar123 * auVar102._0_4_ + fVar129 * auVar82._0_4_));
            local_25a0._20_4_ =
                 (float)(uVar134 ^
                        (uint)(fVar13 * auVar70._4_4_ +
                              fVar126 * auVar102._4_4_ + fVar133 * auVar82._4_4_));
            local_25a0._24_4_ =
                 (float)(uVar136 ^
                        (uint)(fVar18 * auVar70._8_4_ +
                              fVar127 * auVar102._8_4_ + fVar135 * auVar82._8_4_));
            local_25a0._28_4_ =
                 (float)(uVar138 ^
                        (uint)(fVar23 * auVar70._12_4_ +
                              fVar128 * auVar102._12_4_ + fVar137 * auVar82._12_4_));
            auVar102 = ZEXT416(0) << 0x20;
            auVar84 = vcmpps_avx(local_25a0._0_16_,auVar102,5);
            auVar70 = vcmpps_avx(local_25a0._16_16_,auVar102,5);
            auVar84 = vandps_avx(auVar84,auVar70);
            auVar91._8_4_ = 0x7fffffff;
            auVar91._0_8_ = 0x7fffffff7fffffff;
            auVar91._12_4_ = 0x7fffffff;
            local_2570 = vandps_avx(auVar62,auVar91);
            auVar70 = vcmpps_avx(auVar102,auVar62,4);
            auVar84 = vandps_avx(auVar84,auVar70);
            auVar76._0_4_ = local_25a0._0_4_ + local_25a0._16_4_;
            auVar76._4_4_ = local_25a0._4_4_ + local_25a0._20_4_;
            auVar76._8_4_ = local_25a0._8_4_ + local_25a0._24_4_;
            auVar76._12_4_ = local_25a0._12_4_ + local_25a0._28_4_;
            auVar70 = vcmpps_avx(auVar76,local_2570,2);
            auVar84 = vandps_avx(auVar84,auVar70);
            auVar5._8_8_ = uStack_25b8;
            auVar5._0_8_ = local_25c0;
            auVar5 = auVar5 & auVar84;
            if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar5[0xf] < '\0') {
              auVar30._8_8_ = uStack_25b8;
              auVar30._0_8_ = local_25c0;
              auVar84 = vandps_avx(auVar84,auVar30);
              local_2580._0_4_ =
                   (float)(uVar130 ^
                          (uint)(local_2510._0_4_ * fVar81 +
                                local_2500._0_4_ * fVar109 + fVar149 * auVar85._0_4_));
              local_2580._4_4_ =
                   (float)(uVar134 ^
                          (uint)(local_2510._4_4_ * fVar94 +
                                local_2500._4_4_ * fVar113 + fVar14 * auVar85._4_4_));
              local_2580._8_4_ =
                   (float)(uVar136 ^
                          (uint)(local_2510._8_4_ * fVar95 +
                                local_2500._8_4_ * fVar114 + fVar19 * auVar85._8_4_));
              local_2580._12_4_ =
                   (float)(uVar138 ^
                          (uint)(local_2510._12_4_ * fVar96 +
                                local_2500._12_4_ * fVar115 + fVar24 * auVar85._12_4_));
              auVar108 = ZEXT1664(local_2580);
              fVar58 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar67 = local_2570._0_4_;
              auVar63._0_4_ = fVar67 * fVar58;
              fVar68 = local_2570._4_4_;
              auVar63._4_4_ = fVar68 * fVar58;
              fVar69 = local_2570._8_4_;
              auVar63._8_4_ = fVar69 * fVar58;
              fVar120 = local_2570._12_4_;
              auVar63._12_4_ = fVar120 * fVar58;
              auVar70 = vcmpps_avx(auVar63,local_2580,1);
              fVar58 = (ray->super_RayK<1>).tfar;
              auVar77._0_4_ = fVar67 * fVar58;
              auVar77._4_4_ = fVar68 * fVar58;
              auVar77._8_4_ = fVar69 * fVar58;
              auVar77._12_4_ = fVar120 * fVar58;
              auVar102 = vcmpps_avx(local_2580,auVar77,2);
              auVar70 = vandps_avx(auVar102,auVar70);
              auVar101 = ZEXT1664(auVar70);
              auVar102 = auVar84 & auVar70;
              if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar102[0xf] < '\0') {
                auVar84 = vandps_avx(auVar84,auVar70);
                local_2550 = auVar84;
                local_26e0 = auVar85._0_8_;
                uStack_26d8 = auVar85._8_8_;
                local_24f0 = local_26e0;
                uStack_24e8 = uStack_26d8;
                auVar70 = vrcpps_avx(local_2570);
                fVar58 = auVar70._0_4_;
                auVar78._0_4_ = fVar67 * fVar58;
                fVar67 = auVar70._4_4_;
                auVar78._4_4_ = fVar68 * fVar67;
                fVar68 = auVar70._8_4_;
                auVar78._8_4_ = fVar69 * fVar68;
                fVar69 = auVar70._12_4_;
                auVar78._12_4_ = fVar120 * fVar69;
                auVar92._8_4_ = 0x3f800000;
                auVar92._0_8_ = &DAT_3f8000003f800000;
                auVar92._12_4_ = 0x3f800000;
                auVar70 = vsubps_avx(auVar92,auVar78);
                fVar58 = fVar58 + fVar58 * auVar70._0_4_;
                fVar67 = fVar67 + fVar67 * auVar70._4_4_;
                fVar68 = fVar68 + fVar68 * auVar70._8_4_;
                fVar69 = fVar69 + fVar69 * auVar70._12_4_;
                auVar105._0_4_ = fVar58 * local_2580._0_4_;
                auVar105._4_4_ = fVar67 * local_2580._4_4_;
                auVar105._8_4_ = fVar68 * local_2580._8_4_;
                auVar105._12_4_ = fVar69 * local_2580._12_4_;
                local_2690 = auVar84;
                local_2520 = auVar105;
                local_2540[0] = fVar58 * local_25a0._0_4_;
                local_2540[1] = fVar67 * local_25a0._4_4_;
                local_2540[2] = fVar68 * local_25a0._8_4_;
                local_2540[3] = fVar69 * local_25a0._12_4_;
                local_2530[0] = fVar58 * local_25a0._16_4_;
                local_2530[1] = fVar67 * local_25a0._20_4_;
                local_2530[2] = fVar68 * local_25a0._24_4_;
                local_2530[3] = fVar69 * local_25a0._28_4_;
                auVar64._8_4_ = 0x7f800000;
                auVar64._0_8_ = 0x7f8000007f800000;
                auVar64._12_4_ = 0x7f800000;
                auVar70 = vblendvps_avx(auVar64,auVar105,auVar84);
                auVar85 = vshufps_avx(auVar70,auVar70,0xb1);
                auVar85 = vminps_avx(auVar85,auVar70);
                auVar102 = vshufpd_avx(auVar85,auVar85,1);
                auVar85 = vminps_avx(auVar102,auVar85);
                auVar70 = vcmpps_avx(auVar70,auVar85,0);
                auVar85 = auVar84 & auVar70;
                if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar85[0xf] < '\0') {
                  auVar84 = vandps_avx(auVar70,auVar84);
                }
                auVar101 = ZEXT1664(auVar84);
                uVar35 = vmovmskps_avx(auVar84);
                uVar39 = CONCAT44((int)((ulong)lVar38 >> 0x20),uVar35);
                piVar55 = (int *)0x0;
                _local_24d0 = auVar65;
                _local_24c0 = auVar31;
                _local_24b0 = auVar32;
                _local_24a0 = auVar33;
                if (uVar39 != 0) {
                  for (; (uVar39 >> (long)piVar55 & 1) == 0; piVar55 = (int *)((long)piVar55 + 1)) {
                  }
                }
LAB_015b1c0d:
                uVar130 = *(uint *)((long)&local_2490 + (long)piVar55 * 4);
                pGVar6 = (local_2678->geometries).items[uVar130].ptr;
                if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) {
                  *(undefined4 *)(local_2690 + (long)piVar55 * 4) = 0;
LAB_015b1e11:
                  if ((((local_2690 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2690 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2690 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2690[0xf]) goto LAB_015b1f16;
                  auVar101 = ZEXT1664(auVar101._0_16_);
                  auVar112 = ZEXT1664(auVar112._0_16_);
                  BVHNIntersector1<8,16777232,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_2670);
                  piVar55 = local_2670.valid;
                  goto LAB_015b1c0d;
                }
                pRVar7 = context->args;
                if ((pRVar7->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_2670.context = context->user;
                  local_25ec = *(uint *)(local_2500 + (long)piVar55 * 4);
                  auVar101 = ZEXT464(local_25ec);
                  local_25f0 = *(float *)(local_2510 + (long)piVar55 * 4);
                  local_25e8 = *(undefined4 *)((long)&local_24f0 + (long)piVar55 * 4);
                  local_25e4 = local_2540[(long)piVar55];
                  local_25e0 = local_2530[(long)piVar55];
                  local_25dc = *(undefined4 *)((long)&local_25b0 + (long)piVar55 * 4);
                  local_25d8 = uVar130;
                  local_25d4 = (local_2670.context)->instID[0];
                  local_25d0 = (local_2670.context)->instPrimID[0];
                  fVar58 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_2520 + (long)piVar55 * 4);
                  local_26b4 = -1;
                  local_2670.valid = &local_26b4;
                  local_2670.geometryUserPtr = pGVar6->userPtr;
                  local_2670.ray = (RTCRayN *)ray;
                  local_2670.hit = (RTCHitN *)&local_25f0;
                  local_2670.N = 1;
                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015b1d79:
                    if (pRVar7->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                        auVar101 = ZEXT1664(auVar101._0_16_);
                        auVar112 = ZEXT1664(auVar112._0_16_);
                        (*pRVar7->filter)(&local_2670);
                      }
                      if (*local_2670.valid == 0) goto LAB_015b1e53;
                    }
                    (((Vec3f *)((long)local_2670.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_2670.hit;
                    (((Vec3f *)((long)local_2670.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_2670.hit + 4);
                    (((Vec3f *)((long)local_2670.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_2670.hit + 8);
                    *(float *)((long)local_2670.ray + 0x3c) = *(float *)(local_2670.hit + 0xc);
                    *(float *)((long)local_2670.ray + 0x40) = *(float *)(local_2670.hit + 0x10);
                    *(float *)((long)local_2670.ray + 0x44) = *(float *)(local_2670.hit + 0x14);
                    *(float *)((long)local_2670.ray + 0x48) = *(float *)(local_2670.hit + 0x18);
                    *(float *)((long)local_2670.ray + 0x4c) = *(float *)(local_2670.hit + 0x1c);
                    *(float *)((long)local_2670.ray + 0x50) = *(float *)(local_2670.hit + 0x20);
                  }
                  else {
                    auVar101 = ZEXT464(local_25ec);
                    auVar112 = ZEXT1664(auVar112._0_16_);
                    (*pGVar6->intersectionFilterN)(&local_2670);
                    if (*local_2670.valid != 0) goto LAB_015b1d79;
LAB_015b1e53:
                    (ray->super_RayK<1>).tfar = fVar58;
                  }
                  *(undefined4 *)(local_2690 + (long)piVar55 * 4) = 0;
                  fVar58 = (ray->super_RayK<1>).tfar;
                  auVar65._4_4_ = fVar58;
                  auVar65._0_4_ = fVar58;
                  auVar65._8_4_ = fVar58;
                  auVar65._12_4_ = fVar58;
                  auVar84 = vcmpps_avx(auVar105,auVar65,2);
                  local_2690 = vandps_avx(auVar84,local_2690);
                  goto LAB_015b1e11;
                }
                fVar58 = local_2540[(long)piVar55];
                fVar67 = local_2530[(long)piVar55];
                (ray->super_RayK<1>).tfar = *(float *)(local_2520 + (long)piVar55 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2510 + (long)piVar55 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2500 + (long)piVar55 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)((long)&local_24f0 + (long)piVar55 * 4);
                ray->u = fVar58;
                ray->v = fVar67;
                ray->primID = *(uint *)((long)&local_25b0 + (long)piVar55 * 4);
                ray->geomID = uVar130;
                pRVar8 = context->user;
                ray->instID[0] = pRVar8->instID[0];
                ray->instPrimID[0] = pRVar8->instPrimID[0];
LAB_015b1f16:
                auVar108 = ZEXT1664(auVar105);
              }
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 != local_2600);
        }
        fVar58 = (ray->super_RayK<1>).tfar;
        auVar66 = ZEXT3264(CONCAT428(fVar58,CONCAT424(fVar58,CONCAT420(fVar58,CONCAT416(fVar58,
                                                  CONCAT412(fVar58,CONCAT48(fVar58,CONCAT44(fVar58,
                                                  fVar58))))))));
        auVar119 = ZEXT3264(local_23c0);
        auVar122 = ZEXT3264(local_23e0);
        auVar125 = ZEXT3264(local_2400);
        auVar132 = ZEXT3264(local_2420);
        auVar140 = ZEXT3264(local_2440);
        auVar142 = ZEXT3264(local_2460);
        auVar144 = ZEXT3264(local_2480);
        uVar39 = local_2610;
        uVar43 = local_2620;
        uVar46 = local_2628;
        uVar47 = local_2618;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }